

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::checkIoArraysConsistency(TParseContext *this,TSourceLoc *loc,bool tailOnly)

{
  ulong uVar1;
  pointer feature;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 in_register_00000011;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  TString featureString;
  TString local_58;
  TType *type;
  
  local_58._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  uVar4 = (long)(this->ioArraySymbolResizeList).
                super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
                super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->ioArraySymbolResizeList).
                super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
                super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar1 = uVar4 - 1;
  uVar5 = 0;
  if ((int)CONCAT71(in_register_00000011,tailOnly) != 0) {
    uVar5 = uVar1;
  }
  if (uVar5 < uVar4) {
    bVar6 = true;
    iVar3 = 0;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    do {
      iVar2 = (*(this->ioArraySymbolResizeList).
                super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
                super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar5]->_vptr_TSymbol[0xd])();
      type = (TType *)CONCAT44(extraout_var,iVar2);
      if ((bVar6) || ((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh))
      {
        iVar3 = (*type->_vptr_TType[10])(type);
        iVar3 = getIoArrayImplicitSize(this,(TQualifier *)CONCAT44(extraout_var_00,iVar3),&local_58)
        ;
        iVar2 = 0;
        if (iVar3 != 0) {
          bVar6 = false;
          goto LAB_0041dec3;
        }
        bVar7 = true;
      }
      else {
LAB_0041dec3:
        feature = local_58._M_dataplus._M_p;
        iVar2 = (*(this->ioArraySymbolResizeList).
                  super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
                  super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar5]->_vptr_TSymbol[3])();
        checkIoArrayConsistency
                  (this,loc,iVar3,feature,type,(TString *)CONCAT44(extraout_var_01,iVar2));
        bVar7 = false;
        iVar2 = iVar3;
      }
    } while ((!bVar7) && (bVar7 = uVar1 != uVar5, uVar5 = uVar5 + 1, iVar3 = iVar2, bVar7));
  }
  return;
}

Assistant:

void TParseContext::checkIoArraysConsistency(const TSourceLoc &loc, bool tailOnly)
{
    int requiredSize = 0;
    TString featureString;
    size_t listSize = ioArraySymbolResizeList.size();
    size_t i = 0;

    // If tailOnly = true, only check the last array symbol in the list.
    if (tailOnly) {
        i = listSize - 1;
    }
    for (bool firstIteration = true; i < listSize; ++i) {
        TType &type = ioArraySymbolResizeList[i]->getWritableType();

        // As I/O array sizes don't change, fetch requiredSize only once,
        // except for mesh shaders which could have different I/O array sizes based on type qualifiers.
        if (firstIteration || (language == EShLangMesh)) {
            requiredSize = getIoArrayImplicitSize(type.getQualifier(), &featureString);
            if (requiredSize == 0)
                break;
            firstIteration = false;
        }

        checkIoArrayConsistency(loc, requiredSize, featureString.c_str(), type,
                                ioArraySymbolResizeList[i]->getName());
    }
}